

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

bool __thiscall tcu::CommandLine::parse(CommandLine *this,int argc,char **argv)

{
  CommandLine *dst;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ValueType *pVVar5;
  ValueType *pVVar6;
  ValueType *pVVar7;
  ValueType *pVVar8;
  ostream *poVar9;
  bool bVar10;
  Parser parser;
  ostream debugOut;
  DebugOutStreambuf sbuf;
  Parser local_350;
  FilePath local_338;
  string local_318;
  ostream local_2f8 [8];
  ios_base local_2f0 [264];
  DebugOutStreambuf local_1e8;
  
  DebugOutStreambuf::DebugOutStreambuf(&local_1e8);
  std::ostream::ostream(local_2f8,&local_1e8.super_streambuf);
  de::cmdline::detail::Parser::Parser(&local_350);
  opt::registerOptions(&local_350);
  opt::registerLegacyOptions(&local_350);
  (**this->_vptr_CommandLine)(this,&local_350);
  clear(this);
  dst = &this->m_cmdLine;
  bVar1 = de::cmdline::detail::Parser::parse
                    (&local_350,argc + -1,argv + 1,dst,(ostream *)&std::cerr);
  if (bVar1) {
    pVVar5 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::LogImages>(&dst->m_options);
    if (*pVVar5 == false) {
      *(byte *)&this->m_logFlags = (byte)this->m_logFlags | 1;
    }
    pVVar6 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::LogShaderSources>(&dst->m_options);
    if (*pVVar6 == false) {
      *(byte *)&this->m_logFlags = (byte)this->m_logFlags | 2;
    }
    pVVar7 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::LogFlush>(&dst->m_options);
    if (*pVVar7 == false) {
      *(byte *)&this->m_logFlags = (byte)this->m_logFlags | 4;
    }
    bVar1 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CasePath>(&dst->m_options);
    bVar2 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CaseList>(&dst->m_options);
    bVar3 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CaseListFile>(&dst->m_options);
    bVar4 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CaseListResource>
                      (&dst->m_options);
    pVVar8 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::StdinCaseList>(&dst->m_options);
    bVar10 = true;
    if ((uint)*pVVar8 + (uint)bVar4 + (uint)bVar3 + (uint)bVar2 + (uint)bVar1 < 2)
    goto LAB_008ceb34;
    poVar9 = std::operator<<(local_2f8,"ERROR: multiple test case list options given!\n");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    poVar9 = std::operator<<(local_2f8,"\n");
    de::FilePath::FilePath(&local_338,*argv);
    de::FilePath::getBaseName_abi_cxx11_(&local_318,&local_338);
    poVar9 = std::operator<<(poVar9,(string *)&local_318);
    std::operator<<(poVar9," [options]\n\n");
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    de::cmdline::detail::Parser::help(&local_350,local_2f8);
  }
  clear(this);
  bVar10 = false;
LAB_008ceb34:
  de::cmdline::detail::Parser::~Parser(&local_350);
  std::ios_base::~ios_base(local_2f0);
  DebugOutStreambuf::~DebugOutStreambuf(&local_1e8);
  return bVar10;
}

Assistant:

bool CommandLine::parse (int argc, const char* const* argv)
{
	DebugOutStreambuf	sbuf;
	std::ostream		debugOut	(&sbuf);
	de::cmdline::Parser	parser;

	opt::registerOptions(parser);
	opt::registerLegacyOptions(parser);
	registerExtendedOptions(parser);

	clear();

	if (!parser.parse(argc-1, argv+1, &m_cmdLine, std::cerr))
	{
		debugOut << "\n" << de::FilePath(argv[0]).getBaseName() << " [options]\n\n";
		parser.help(debugOut);

		clear();
		return false;
	}

	if (!m_cmdLine.getOption<opt::LogImages>())
		m_logFlags |= QP_TEST_LOG_EXCLUDE_IMAGES;

	if (!m_cmdLine.getOption<opt::LogShaderSources>())
		m_logFlags |= QP_TEST_LOG_EXCLUDE_SHADER_SOURCES;

	if (!m_cmdLine.getOption<opt::LogFlush>())
		m_logFlags |= QP_TEST_LOG_NO_FLUSH;

	if ((m_cmdLine.hasOption<opt::CasePath>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseList>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseListFile>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseListResource>()?1:0) +
		(m_cmdLine.getOption<opt::StdinCaseList>()?1:0) > 1)
	{
		debugOut << "ERROR: multiple test case list options given!\n" << std::endl;
		clear();
		return false;
	}

	return true;
}